

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O0

void re_build_char(re_context *ctx,re_machine *machine,char ch)

{
  char in_DL;
  re_context *in_RSI;
  re_context *in_RDI;
  undefined7 in_stack_ffffffffffffffe8;
  
  re_init_machine(in_RSI,(re_machine *)CONCAT17(in_DL,in_stack_ffffffffffffffe8));
  re_set_trans(in_RDI,*(re_state_id *)&in_RSI->errctx,*(re_state_id *)((long)&in_RSI->errctx + 4),
               in_DL);
  return;
}

Assistant:

static void re_build_char(re_context *ctx, re_machine *machine, char ch)
{
    /* initialize our new machine */
    re_init_machine(ctx, machine);

    /* allocate a transition tuple for the new state */
    re_set_trans(ctx, machine->init, machine->final, ch);
}